

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# char_conversions.cpp
# Opt level: O3

string * __thiscall
mjs::unicode::utf16_to_utf8_abi_cxx11_(string *__return_storage_ptr__,unicode *this,wstring_view in)

{
  uint uVar1;
  conversion_result cVar2;
  undefined8 *puVar3;
  ulong uVar4;
  uint uVar5;
  char buffer [4];
  char local_34 [4];
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  uVar5 = (uint)this;
  if (uVar5 != 0) {
    uVar4 = 0;
    do {
      cVar2 = utf16_to_utf32<wchar_t>((wchar_t *)(in._M_len + uVar4 * 4),uVar5 - (int)uVar4);
      if (cVar2.length == 0) {
        puVar3 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar3 = &PTR__exception_001d7ce0;
        __cxa_throw(puVar3,&conversion_error::typeinfo,std::exception::~exception);
      }
      uVar1 = utf32_to_utf8<char>(cVar2.code_point,local_34);
      if (uVar1 == 0) {
        puVar3 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar3 = &PTR__exception_001d7ce0;
        __cxa_throw(puVar3,&conversion_error::typeinfo,std::exception::~exception);
      }
      std::__cxx11::string::replace
                ((ulong)__return_storage_ptr__,__return_storage_ptr__->_M_string_length,(char *)0x0,
                 (ulong)local_34);
      uVar1 = (int)uVar4 + cVar2.length;
      uVar4 = (ulong)uVar1;
    } while (uVar1 < uVar5);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string utf16_to_utf8(const std::wstring_view in) {
    std::string res;
    const auto l = static_cast<unsigned>(in.length());
    char buffer[utf8_max_length];
    for (unsigned i = 0; i < l;) {
        const auto conv = utf16_to_utf32(&in[i], l - i);
        if (conv.length == invalid_length) {
            throw conversion_error{};
        }
        const auto out_len = utf32_to_utf8(conv.code_point, buffer);
        if (!out_len) {
            throw conversion_error{};
        }
        res.insert(res.end(), buffer, buffer + out_len);
        i += conv.length;
    }

    return res;
}